

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O2

void report_bad(bool passed,char *c)

{
  char *pcVar1;
  undefined7 in_register_00000039;
  
  pcVar1 = "FAIL";
  if ((int)CONCAT71(in_register_00000039,passed) != 0) {
    pcVar1 = "pass";
  }
  printf("%s: decoding bad  ",pcVar1);
  test_utf8_char_print(c);
  putchar(0x20);
  return;
}

Assistant:

static void report_bad(bool passed, test_utf8_char const c)
{
  printf("%s: decoding bad  ", passed ? "pass" : "FAIL");
  test_utf8_char_print(c);
  printf(" ");
}